

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

int __thiscall TPZFMatrix<long>::Decompose_LU(TPZFMatrix<long> *this,TPZVec<int> *index)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int64_t iVar6;
  int64_t iVar7;
  ostream *poVar8;
  int *piVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  int extraout_var_10;
  TPZVec<int> *in_RSI;
  TPZBaseMatrix *in_RDI;
  __type_conflict _Var10;
  __type_conflict _Var11;
  long aux_3;
  long aux_2;
  long aux_1;
  int64_t row;
  long piv;
  long aux;
  int64_t nCols;
  int64_t nRows;
  long sum;
  int64_t k;
  int64_t j;
  int64_t i;
  size_t in_stack_00000338;
  char *in_stack_00000340;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  int64_t local_48;
  int64_t local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  TPZVec<int> *local_18;
  int local_4;
  
  if (in_RDI->fDecomposed == '\0') {
    local_18 = in_RSI;
    iVar6 = TPZBaseMatrix::Rows(in_RDI);
    iVar7 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar6 == iVar7) {
      local_38 = 0;
      local_40 = TPZBaseMatrix::Rows(in_RDI);
      local_48 = TPZBaseMatrix::Cols(in_RDI);
      (*local_18->_vptr_TPZVec[3])(local_18,local_40);
      for (local_20 = 0; local_20 < local_40; local_20 = local_20 + 1) {
        iVar4 = (int)local_20;
        piVar9 = TPZVec<int>::operator[](local_18,local_20);
        *piVar9 = iVar4;
      }
      for (local_28 = 0; local_28 < local_48; local_28 = local_28 + 1) {
        for (local_20 = 0; local_20 <= local_28; local_20 = local_20 + 1) {
          local_38 = 0;
          for (local_30 = 0; local_30 < local_20; local_30 = local_30 + 1) {
            iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_20,local_30);
            iVar5 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_30,local_28);
            local_38 = CONCAT44(extraout_var,iVar4) * CONCAT44(extraout_var_00,iVar5) + local_38;
          }
          iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_20,local_28);
          local_50 = CONCAT44(extraout_var_01,iVar4);
          local_58 = local_50 - local_38;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_20,local_28,&local_58);
        }
        iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_28,local_28);
        local_60 = CONCAT44(extraout_var_02,iVar4);
        local_68 = local_28;
        local_20 = local_28;
        while (local_20 = local_20 + 1, local_20 < local_40) {
          local_38 = 0;
          for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
            iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_20,local_30);
            iVar5 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_30,local_28);
            local_38 = CONCAT44(extraout_var_03,iVar4) * CONCAT44(extraout_var_04,iVar5) + local_38;
          }
          iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_20,local_28);
          local_70 = CONCAT44(extraout_var_05,iVar4);
          local_78 = local_70 - local_38;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_20,local_28,&local_78);
          iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_20,local_28);
          _Var10 = std::fabs<long>(CONCAT44(extraout_var_06,iVar4));
          _Var11 = std::fabs<long>(local_60);
          if (_Var11 < _Var10) {
            iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_20,local_28);
            local_60 = CONCAT44(extraout_var_07,iVar4);
            local_68 = local_20;
          }
        }
        lVar2 = local_28;
        if (local_28 < local_68) {
          for (local_30 = 0; local_30 < local_48; local_30 = local_30 + 1) {
            iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_28,local_30);
            lVar3 = local_28;
            lVar2 = local_30;
            local_80 = CONCAT44(extraout_var_08,iVar4);
            iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_68,local_30);
            local_88 = CONCAT44(extraout_var_09,iVar4);
            (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar3,lVar2,&local_88);
            (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_68,local_30,&local_80)
            ;
          }
          piVar9 = TPZVec<int>::operator[](local_18,local_28);
          local_30 = (long)*piVar9;
          piVar9 = TPZVec<int>::operator[](local_18,local_68);
          iVar4 = *piVar9;
          piVar9 = TPZVec<int>::operator[](local_18,local_28);
          *piVar9 = iVar4;
          iVar4 = (int)local_30;
          piVar9 = TPZVec<int>::operator[](local_18,local_68);
          *piVar9 = iVar4;
          lVar2 = local_28;
        }
        while (local_20 = lVar2 + 1, local_20 < local_40) {
          _Var10 = std::fabs<long>(local_60);
          _Var11 = std::fabs<long>(0);
          if (_Var10 < _Var11) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "Pivot < 1e-12. Probably matrix is singular.");
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            pzinternal::DebugStopImpl(in_stack_00000340,in_stack_00000338);
          }
          iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_20,local_28);
          auVar1._4_4_ = extraout_var_10;
          auVar1._0_4_ = iVar4;
          auVar1._8_8_ = (long)extraout_var_10 >> 0x1f;
          local_90 = SUB168(auVar1 / SEXT816(local_60),0);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_20,local_28,&local_90);
          lVar2 = local_20;
        }
      }
      in_RDI->fDecomposed = '\x02';
      local_4 = 1;
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_266c75);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZFMatrix<TVar>::Decompose_LU(TPZVec<int> &index) {
    
    if (this->fDecomposed) return 0;
    
    if ( this->Rows() != this->Cols() ) {
        cout << "TPZFPivotMatrix::DecomposeLU ERRO : A Matriz não é quadrada" << endl;
        return 0;
    }
    
    int64_t i,j,k;
    TVar sum = 0.;
    int64_t nRows = this->Rows();
    int64_t nCols = this->Cols();
    
    index.Resize(nRows);
    //inicializo o vetor de índices para o caso de pivotamento
    for (i=0;i<nRows;i++) index[i] = i;
    
    //LU
    for (j=0;j<nCols;j++){
        // cout << "line..." << j << endl;
        for (i=0;i<=j;i++){
            sum = 0.;
            for (k=0;k<i;k++){
                sum += this->Get(i,k) * this->Get(k,j);
            }
            TVar aux = this->Get(i,j);
            PutVal(i,j,(aux - sum));
            //cout << "0_A[" << i << "," << j << "]= " << Get(i,j) << endl;
        }
        //Print(cout);
        TVar piv = this->Get(j,j);
        //  cout << "Pivo 1 =" << piv << endl;
        int64_t row = j;
        for (i=j+1;i<nRows;i++){
            sum = 0.;
            for (k=0;k<(j);k++){
                sum += this->Get(i,k) * this->Get(k,j);
            }
            TVar aux = this->Get(i,j);
            PutVal(i,j,(aux - sum));
            //cout << "1_A[" << i << "," << j << "]= " << Get(i,j) << endl;
            
            if (fabs(this->Get(i,j)) > fabs(piv)){
                piv = this->Get(i,j);
                //  cout << "Pivo 2 =" << piv << endl;
                row = i;
            }
        }
        //    Print(cout);
        if (row > j){
            for (k=0;k<nCols;k++){
                TVar aux = this->Get(j,k);
                PutVal(j,k,this->Get(row,k));
                //cout << "2_A[" << j << "," << k << "]= " << Get(j,k) << endl;
                PutVal(row,k,aux);
                //cout << "3_A[" << row << "," << k << "]= " << Get(row,k) << endl;
            }
            k = index[j];
            index[j] = index[row];
            index[row] = k;
        }
        //    cout << "Pivo = " << piv << endl;
        for (i=j+1;i<nRows;i++){
            if (fabs(piv) < fabs((TVar)1e-12)) {
                cout << "Pivot < 1e-12. Probably matrix is singular." << endl;
                DebugStop();
            }
            TVar aux = this->Get(i,j) / piv;
            PutVal(i,j,aux);
            //cout << "4_A[" << i << "," << j << "]= " << Get(i,j) << endl;
        }
        //Print(cout);
    }
    this->fDecomposed = ELUPivot;
    return 1;
}